

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void expr(Vm *vm)

{
  TokenType TVar1;
  Token var_decl;
  Token identifier;
  _Bool _Var2;
  uint32_t uVar3;
  CallFrame *frame;
  ObjLambda *object;
  uint8_t num_params;
  CrispyValue value;
  CrispyValue CVar4;
  Token param;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_IDENTIFIER) {
    assignment(vm);
    return;
  }
  if (TVar1 == TOKEN_OPEN_BRACE) {
    block_expr(vm);
    return;
  }
  if (TVar1 == TOKEN_IF) {
    if_expr(vm);
    return;
  }
  if (TVar1 == TOKEN_FUN) {
    advance(vm);
    open_scope(vm);
    num_params = '\0';
    frame = new_call_frame();
    uVar3 = vm->frame_count;
    vm->frame_count = uVar3 + 1;
    frames_write_at(&vm->frames,uVar3,frame);
    if ((vm->compiler).token.type != TOKEN_ARROW) {
      num_params = '\0';
      do {
        consume(&param,vm,TOKEN_IDENTIFIER,"Expected parameter name");
        var_decl.start = param.start;
        var_decl.type = param.type;
        var_decl._4_4_ = param._4_4_;
        var_decl.length = param.length;
        var_decl.line = param.line;
        var_decl._28_4_ = param._28_4_;
        declare_var(vm,var_decl,true);
        identifier.start = param.start;
        identifier.type = param.type;
        identifier._4_4_ = param._4_4_;
        identifier.length = param.length;
        identifier.line = param.line;
        identifier._28_4_ = param._28_4_;
        define_var(vm,identifier);
        num_params = num_params + '\x01';
        _Var2 = match(vm,TOKEN_COMMA);
      } while (_Var2);
    }
    consume(&param,vm,TOKEN_ARROW,"Expected \'->\' after parameter list");
    emit_no_arg(vm,OP_POP);
    expr(vm);
    emit_no_arg(vm,OP_RETURN);
    vm->frame_count = vm->frame_count - 1;
    object = new_lambda(vm,num_params);
    object->call_frame = frame;
    frame->ip = (frame->code_buffer).code;
    CVar4 = create_object(&object->object);
    value.field_1 = CVar4.field_1;
    value._4_4_ = 0;
    value.type = CVar4.type;
    uVar3 = add_constant(vm,value);
    if ((uVar3 & 0xff00) == 0) {
      emit_byte_arg(vm,OP_LDC,(uint8_t)uVar3);
    }
    else {
      emit_short_arg(vm,OP_LDC_W,(uint8_t)(uVar3 >> 8),(uint8_t)uVar3);
    }
    close_scope(vm);
    return;
  }
  logic_or(vm);
  return;
}

Assistant:

static void expr(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_FUN:
            lambda(vm);
            break;
        case TOKEN_OPEN_BRACE:
            block_expr(vm);
            break;
        case TOKEN_IF:
            if_expr(vm);
            break;
        case TOKEN_IDENTIFIER:
            assignment(vm);
            break;
        default:
            logic_or(vm);
            break;
    }
}